

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::ContextState::ContextState(ContextState *this)

{
  allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_> local_11;
  ContextState *local_10;
  ContextState *this_local;
  
  local_10 = this;
  std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>::allocator
            (&local_11);
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::vector(&this->filters,6,&local_11);
  std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>::~allocator
            (&local_11);
  String::String(&this->order_by,"");
  std::
  set<doctest::detail::SubcaseSignature,_std::less<doctest::detail::SubcaseSignature>,_std::allocator<doctest::detail::SubcaseSignature>_>
  ::set(&this->subcasesPassed);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->subcasesEnteredLevels);
  std::vector<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>::vector
            (&this->subcasesStack);
  resetRunData(this);
  return;
}

Assistant:

ContextState()
                : filters(6) // 6 different filters total
        {
            resetRunData();
        }